

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void pnga_set_restricted_range(Integer g_a,Integer lo_proc,Integer hi_proc)

{
  global_array_t *pgVar1;
  C_Integer *pCVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long icode;
  long lVar6;
  C_Integer CVar7;
  C_Integer CVar8;
  Integer local_40;
  
  pgVar1 = GA;
  lVar6 = g_a + 1000;
  GA[lVar6].num_rstrctd = (hi_proc - lo_proc) + 1;
  pCVar2 = (C_Integer *)malloc((hi_proc - lo_proc) * 8 + 8);
  pgVar1[lVar6].rstrctd_list = pCVar2;
  local_40 = GAnproc;
  pCVar2 = (C_Integer *)malloc(GAnproc * 8);
  GA[lVar6].rank_rstrctd = pCVar2;
  uVar3 = GA[lVar6].p_handle;
  if (GA[lVar6].p_handle == 0xfffffffe) {
    uVar3 = GA_Default_Proc_Group;
  }
  lVar4 = GAme;
  if (0 < (int)uVar3) {
    local_40 = (Integer)PGRP_LIST[uVar3].map_nproc;
    lVar4 = (long)PGRP_LIST[uVar3].map_proc_list[GAme];
  }
  if (0 < GAnproc) {
    pCVar2 = GA[lVar6].rank_rstrctd;
    lVar5 = 0;
    do {
      pCVar2[lVar5] = -1;
      lVar5 = lVar5 + 1;
    } while (lVar5 < GAnproc);
  }
  if (hi_proc < lo_proc) {
    CVar8 = 0;
    CVar7 = 0;
  }
  else {
    CVar7 = 0;
    lVar5 = 0;
    CVar8 = 0;
    do {
      if ((lo_proc - lVar4) + lVar5 == 0) {
        CVar8 = 1;
        CVar7 = lVar5;
      }
      icode = lo_proc + lVar5;
      GA[lVar6].rstrctd_list[lVar5] = icode;
      if ((icode < 0) || (local_40 <= icode)) {
        pnga_error("Invalid processor in list",icode);
      }
      GA[lVar6].rank_rstrctd[lo_proc + lVar5] = lVar5;
      lVar5 = lVar5 + 1;
    } while (~hi_proc + lo_proc + lVar5 != 0);
  }
  pgVar1 = GA;
  GA[lVar6].has_data = CVar8;
  pgVar1[lVar6].rstrctd_id = CVar7;
  return;
}

Assistant:

void pnga_set_restricted_range(Integer g_a, Integer lo_proc, Integer hi_proc)
{
  Integer i, ig, id=0, me, p_handle, has_data, icnt, nproc, size;
  Integer ga_handle = g_a + GA_OFFSET;
  size = hi_proc - lo_proc + 1;
  GA[ga_handle].num_rstrctd = size;
  GA[ga_handle].rstrctd_list = (Integer*)malloc((size)*sizeof(Integer));
  GA[ga_handle].rank_rstrctd = (Integer*)malloc((GAnproc)*sizeof(Integer));
  p_handle = GA[ga_handle].p_handle;
  if (p_handle == -2) p_handle = pnga_pgroup_get_default();
  if (p_handle > 0) {
    me = PGRP_LIST[p_handle].map_proc_list[GAme];
    nproc = PGRP_LIST[p_handle].map_nproc;
  } else {
    me = GAme;
    nproc = GAnproc;
  }
  has_data = 0;

  for (i=0; i<GAnproc; i++) {
    GA[ga_handle].rank_rstrctd[i] = -1;
  }

  icnt = 0;
  for (i=lo_proc; i<=hi_proc; i++) {
    GA[ga_handle].rstrctd_list[icnt] = i;
    /* check if processor is in list */
    if (me == i) {
      has_data = 1;
      id = icnt;
    }
    /* check if processor is in group */
    if (i < 0 || i >= nproc)
      pnga_error("Invalid processor in list",i);
    ig = i;
    GA[ga_handle].rank_rstrctd[ig] = icnt;
    icnt++;
  }
  GA[ga_handle].has_data = has_data;
  GA[ga_handle].rstrctd_id = id;
}